

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O2

void fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
               (uint64_t *out1,fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 arg1,uint64_t *arg2,
               uint64_t *arg3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined7 in_register_00000031;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar5 = -(ulong)((int)CONCAT71(in_register_00000031,arg1) != 0);
  uVar6 = ~uVar5;
  uVar3 = arg3[4];
  uVar4 = arg2[4];
  auVar7._8_4_ = (int)uVar5;
  auVar7._0_8_ = uVar5;
  auVar7._12_4_ = (int)(uVar5 >> 0x20);
  auVar1 = *(undefined1 (*) [16])(arg3 + 2);
  auVar8._8_4_ = (int)uVar6;
  auVar8._0_8_ = uVar6;
  auVar8._12_4_ = (int)(uVar6 >> 0x20);
  auVar2 = *(undefined1 (*) [16])(arg2 + 2);
  *(undefined1 (*) [16])out1 =
       *(undefined1 (*) [16])arg2 & auVar8 | *(undefined1 (*) [16])arg3 & auVar7;
  *(undefined1 (*) [16])(out1 + 2) = auVar2 & auVar8 | auVar1 & auVar7;
  out1[4] = uVar6 & uVar4 | uVar5 & uVar3;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_256_paramSetA_cmovznz_u64(
    uint64_t *out1, fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 arg1,
    uint64_t arg2, uint64_t arg3) {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x1;
    uint64_t x2;
    uint64_t x3;
    x1 = (!(!arg1));
    x2 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_int1)(0x0 - x1) &
          UINT64_C(0xffffffffffffffff));
    x3 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_value_barrier_u64(x2) &
           arg3) |
          (fiat_id_tc26_gost_3410_2012_256_paramSetA_value_barrier_u64((~x2)) &
           arg2));
    *out1 = x3;
}